

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

int archive_write_add_filter_compress(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  int magic_test;
  archive_write_filter *f;
  archive_write *a;
  archive *_a_local;
  
  paVar2 = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_compress");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    paVar2->open = archive_compressor_compress_open;
    paVar2->code = 3;
    paVar2->name = "compress";
    _a_local._4_4_ = 0;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_add_filter_compress(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_compress");
	f->open = &archive_compressor_compress_open;
	f->code = ARCHIVE_FILTER_COMPRESS;
	f->name = "compress";
	return (ARCHIVE_OK);
}